

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void issue288(void)

{
  roaring_bitmap_t *src;
  roaring_bitmap_t *file;
  roaring_bitmap_t *unaff_retaddr;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  uint32_t in_stack_0000002c;
  roaring_bitmap_t *in_stack_00000030;
  int in_stack_ffffffffffffffec;
  
  src = roaring_bitmap_create();
  file = roaring_bitmap_create();
  roaring_bitmap_get_cardinality(unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,(char *)src,(char *)file,in_stack_ffffffffffffffec);
  roaring_bitmap_get_cardinality(unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,(char *)src,(char *)file,in_stack_ffffffffffffffec);
  roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
  roaring_bitmap_get_cardinality(unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,(char *)src,(char *)file,in_stack_ffffffffffffffec);
  roaring_bitmap_overwrite(unaff_retaddr,src);
  roaring_bitmap_get_cardinality(unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,(char *)src,(char *)file,in_stack_ffffffffffffffec);
  roaring_bitmap_get_cardinality(unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,(char *)src,(char *)file,in_stack_ffffffffffffffec);
  roaring_bitmap_free((roaring_bitmap_t *)0x10c095);
  roaring_bitmap_free((roaring_bitmap_t *)0x10c09f);
  return;
}

Assistant:

DEFINE_TEST(issue288) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    assert_true(roaring_bitmap_get_cardinality(r1) == 0);
    assert_true(roaring_bitmap_get_cardinality(r2) == 0);

    roaring_bitmap_add(r1, 42);
    assert_true(roaring_bitmap_get_cardinality(r1) == 1);
    roaring_bitmap_overwrite(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1) == 0);
    assert_true(roaring_bitmap_get_cardinality(r2) == 0);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
}